

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edition_unittest.pb.cc
# Opt level: O1

void edition_unittest::TestDeprecatedFields::MergeImpl(MessageLite *to_msg,MessageLite *from_msg)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  MessageLite *pMVar4;
  MessageLite *to_msg_00;
  ulong uVar5;
  _func_int **pp_Var6;
  void *pvVar7;
  Nonnull<const_char_*> pcVar8;
  Arena *arena;
  
  arena = (Arena *)(to_msg->_internal_metadata_).ptr_;
  if (((ulong)arena & 1) != 0) {
    arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
  }
  if (from_msg == to_msg) {
    pcVar8 = absl::lts_20250127::log_internal::MakeCheckOpString<void_const*,void_const*>
                       (from_msg,to_msg,"&from != _this");
  }
  else {
    pcVar8 = (Nonnull<const_char_*>)0x0;
  }
  if (pcVar8 != (Nonnull<const_char_*>)0x0) goto LAB_00c463d7;
  if (*(int *)&from_msg[2]._vptr_MessageLite != 0) {
    google::protobuf::internal::RepeatedPtrFieldBase::MergeFrom<std::__cxx11::string>
              ((RepeatedPtrFieldBase *)&to_msg[1]._internal_metadata_,
               (RepeatedPtrFieldBase *)&from_msg[1]._internal_metadata_);
  }
  uVar1 = *(uint *)&from_msg[1]._vptr_MessageLite;
  if ((uVar1 & 7) == 0) goto LAB_00c46341;
  if ((uVar1 & 1) != 0) {
    pMVar4 = (MessageLite *)from_msg[3]._vptr_MessageLite;
    if (pMVar4 != (MessageLite *)0x0) {
      if ((MessageLite *)to_msg[3]._vptr_MessageLite == (MessageLite *)0x0) {
        pp_Var6 = (_func_int **)
                  google::protobuf::Arena::
                  CopyConstruct<edition_unittest::TestAllTypes_NestedMessage>(arena,pMVar4);
        to_msg[3]._vptr_MessageLite = pp_Var6;
      }
      else {
        TestAllTypes_NestedMessage::MergeImpl((MessageLite *)to_msg[3]._vptr_MessageLite,pMVar4);
      }
      goto LAB_00c46305;
    }
    MergeImpl((TestDeprecatedFields *)&stack0xffffffffffffffd0);
LAB_00c463cd:
    MergeImpl((TestDeprecatedFields *)&stack0xffffffffffffffd0);
LAB_00c463d7:
    MergeImpl();
  }
LAB_00c46305:
  if ((uVar1 & 2) != 0) {
    pMVar4 = (MessageLite *)from_msg[3]._internal_metadata_.ptr_;
    if (pMVar4 == (MessageLite *)0x0) goto LAB_00c463cd;
    to_msg_00 = (MessageLite *)to_msg[3]._internal_metadata_.ptr_;
    if (to_msg_00 == (MessageLite *)0x0) {
      pvVar7 = google::protobuf::Arena::CopyConstruct<edition_unittest::TestDeprecatedFields>
                         (arena,pMVar4);
      to_msg[3]._internal_metadata_.ptr_ = (intptr_t)pvVar7;
    }
    else {
      MergeImpl(to_msg_00,pMVar4);
    }
  }
  if ((uVar1 & 4) != 0) {
    *(undefined4 *)&to_msg[4]._vptr_MessageLite = *(undefined4 *)&from_msg[4]._vptr_MessageLite;
  }
LAB_00c46341:
  *(uint *)&to_msg[1]._vptr_MessageLite = *(uint *)&to_msg[1]._vptr_MessageLite | uVar1;
  iVar2 = (int)from_msg[4]._internal_metadata_.ptr_;
  if (iVar2 != 0) {
    iVar3 = (int)to_msg[4]._internal_metadata_.ptr_;
    if (iVar3 != iVar2) {
      if (iVar3 != 0) {
        *(undefined4 *)&to_msg[4]._internal_metadata_.ptr_ = 0;
      }
      *(int *)&to_msg[4]._internal_metadata_.ptr_ = iVar2;
    }
    if (iVar2 == 2) {
      *(undefined4 *)((long)&to_msg[4]._vptr_MessageLite + 4) =
           *(undefined4 *)((long)&from_msg[4]._vptr_MessageLite + 4);
    }
  }
  uVar5 = (from_msg->_internal_metadata_).ptr_;
  if ((uVar5 & 1) == 0) {
    return;
  }
  google::protobuf::internal::InternalMetadata::DoMergeFrom<google::protobuf::UnknownFieldSet>
            (&to_msg->_internal_metadata_,(UnknownFieldSet *)((uVar5 & 0xfffffffffffffffe) + 8));
  return;
}

Assistant:

void TestDeprecatedFields::MergeImpl(::google::protobuf::MessageLite& to_msg, const ::google::protobuf::MessageLite& from_msg) {
  auto* const _this = static_cast<TestDeprecatedFields*>(&to_msg);
  auto& from = static_cast<const TestDeprecatedFields&>(from_msg);
  ::google::protobuf::Arena* arena = _this->GetArena();
  // @@protoc_insertion_point(class_specific_merge_from_start:edition_unittest.TestDeprecatedFields)
  ABSL_DCHECK_NE(&from, _this);
  ::uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  _this->_internal_mutable_deprecated_repeated_string()->MergeFrom(from._internal_deprecated_repeated_string());
  cached_has_bits = from._impl_._has_bits_[0];
  if ((cached_has_bits & 0x00000007u) != 0) {
    if ((cached_has_bits & 0x00000001u) != 0) {
      ABSL_DCHECK(from._impl_.deprecated_message_ != nullptr);
      if (_this->_impl_.deprecated_message_ == nullptr) {
        _this->_impl_.deprecated_message_ = ::google::protobuf::Message::CopyConstruct(arena, *from._impl_.deprecated_message_);
      } else {
        _this->_impl_.deprecated_message_->MergeFrom(*from._impl_.deprecated_message_);
      }
    }
    if ((cached_has_bits & 0x00000002u) != 0) {
      ABSL_DCHECK(from._impl_.nested_ != nullptr);
      if (_this->_impl_.nested_ == nullptr) {
        _this->_impl_.nested_ = ::google::protobuf::Message::CopyConstruct(arena, *from._impl_.nested_);
      } else {
        _this->_impl_.nested_->MergeFrom(*from._impl_.nested_);
      }
    }
    if ((cached_has_bits & 0x00000004u) != 0) {
      _this->_impl_.deprecated_int32_ = from._impl_.deprecated_int32_;
    }
  }
  _this->_impl_._has_bits_[0] |= cached_has_bits;
  if (const uint32_t oneof_from_case = from._impl_._oneof_case_[0]) {
    const uint32_t oneof_to_case = _this->_impl_._oneof_case_[0];
    const bool oneof_needs_init = oneof_to_case != oneof_from_case;
    if (oneof_needs_init) {
      if (oneof_to_case != 0) {
        _this->clear_oneof_fields();
      }
      _this->_impl_._oneof_case_[0] = oneof_from_case;
    }

    switch (oneof_from_case) {
      case kDeprecatedInt32InOneof: {
        _this->_impl_.oneof_fields_.deprecated_int32_in_oneof_ = from._impl_.oneof_fields_.deprecated_int32_in_oneof_;
        break;
      }
      case ONEOF_FIELDS_NOT_SET:
        break;
    }
  }
  _this->_internal_metadata_.MergeFrom<::google::protobuf::UnknownFieldSet>(from._internal_metadata_);
}